

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetArrayRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *values,SizeType count,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  void *__dest;
  size_t in_RCX;
  uint in_EDX;
  void *in_RSI;
  uint *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *e;
  undefined4 in_stack_ffffffffffffffc8;
  
  *(undefined2 *)((long)in_RDI + 0xe) = 4;
  if (in_EDX == 0) {
    *(ulong *)(in_RDI + 2) = *(ulong *)(in_RDI + 2) & 0xffff000000000000;
  }
  else {
    __dest = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                       ((MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                        CONCAT44(in_EDX,in_stack_ffffffffffffffc8),in_RCX);
    *(ulong *)(in_RDI + 2) = *(ulong *)(in_RDI + 2) & 0xffff000000000000 | (ulong)__dest;
    memcpy(__dest,in_RSI,(ulong)in_EDX << 4);
  }
  in_RDI[1] = in_EDX;
  *in_RDI = in_EDX;
  return;
}

Assistant:

void SetArrayRaw(GenericValue* values, SizeType count, Allocator& allocator) {
        data_.f.flags = kArrayFlag;
        if (count) {
            GenericValue* e = static_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
            SetElementsPointer(e);
            std::memcpy(e, values, count * sizeof(GenericValue));
        }
        else
            SetElementsPointer(0);
        data_.a.size = data_.a.capacity = count;
    }